

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O0

void CBinds::ConUnbind(IResult *pResult,void *pUserData)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  IConsole *pIVar4;
  long *in_RDI;
  long in_FS_OFFSET;
  int KeyID;
  char *pKeyName;
  CBinds *pBinds;
  int Modifier;
  char aBuf [256];
  int *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  CBinds *in_stack_ffffffffffffff08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,0);
  iVar2 = DecodeBindString((CBinds *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  if (iVar2 == 0) {
    str_format(&stack0xfffffffffffffef8,0x100,"key %s not found",uVar3);
    pIVar4 = CComponent::Console((CComponent *)0x148788);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x19])(pIVar4,0,"binds",&stack0xfffffffffffffef8);
  }
  else {
    Bind(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
         in_stack_fffffffffffffef8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBinds::ConUnbind(IConsole::IResult *pResult, void *pUserData)
{
	CBinds *pBinds = (CBinds *)pUserData;
	const char *pKeyName = pResult->GetString(0);
	int Modifier;
	int KeyID = pBinds->DecodeBindString(pKeyName, &Modifier);

	if(!KeyID)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "key %s not found", pKeyName);
		pBinds->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "binds", aBuf);
		return;
	}

	pBinds->Bind(KeyID, Modifier, "");
}